

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  bool bVar1;
  ImVector<ImDrawList_*> *this_00;
  ImDrawList **__dest;
  ImDrawList **__src;
  ImVector<ImDrawList_*> *layer;
  int layer_n;
  int i;
  int size;
  int n;
  ImDrawDataBuilder *this_local;
  
  i = this->Layers[0].Size;
  layer_n = i;
  for (layer._4_4_ = 1; layer._4_4_ < 2; layer._4_4_ = layer._4_4_ + 1) {
    layer_n = this->Layers[layer._4_4_].Size + layer_n;
  }
  ImVector<ImDrawList_*>::resize(this->Layers,layer_n);
  for (layer._0_4_ = 1; (int)layer < 2; layer._0_4_ = (int)layer + 1) {
    this_00 = this->Layers + (int)layer;
    bVar1 = ImVector<ImDrawList_*>::empty(this_00);
    if (!bVar1) {
      __dest = ImVector<ImDrawList_*>::operator[](this->Layers,i);
      __src = ImVector<ImDrawList_*>::operator[](this_00,0);
      memcpy(__dest,__src,(long)this_00->Size << 3);
      i = this_00->Size + i;
      ImVector<ImDrawList_*>::resize(this_00,0);
    }
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}